

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIrrDeviceStub.cpp
# Opt level: O0

bool __thiscall irr::CIrrDeviceStub::checkVersion(CIrrDeviceStub *this,char *version)

{
  int iVar1;
  char *__s1;
  Printer *this_00;
  char *in_RSI;
  string<char> *in_RDI;
  double __x;
  stringc w;
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffd0;
  string<char> *in_stack_ffffffffffffffd8;
  
  __s1 = (char *)(**(code **)(*(long *)&in_RDI->str + 0xb0))();
  iVar1 = strcmp(__s1,in_RSI);
  if (iVar1 != 0) {
    core::string<char>::string((string<char> *)0x399aa1);
    core::string<char>::operator=(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    (**(code **)(*(long *)&in_RDI->str + 0xb0))();
    core::string<char>::operator+=(in_RDI,in_stack_ffffffffffffffb8);
    core::string<char>::operator+=(in_RDI,in_stack_ffffffffffffffb8);
    core::string<char>::operator+=(in_RDI,in_stack_ffffffffffffffb8);
    core::string<char>::operator+=(in_RDI,in_stack_ffffffffffffffb8);
    this_00 = (Printer *)core::string<char>::c_str((string<char> *)0x399b08);
    os::Printer::log(this_00,__x);
    core::string<char>::~string((string<char> *)0x399b24);
  }
  return iVar1 == 0;
}

Assistant:

bool CIrrDeviceStub::checkVersion(const char *version)
{
	if (strcmp(getVersion(), version)) {
		core::stringc w;
		w = "Warning: The library version of the Irrlicht Engine (";
		w += getVersion();
		w += ") does not match the version the application was compiled with (";
		w += version;
		w += "). This may cause problems.";
		os::Printer::log(w.c_str(), ELL_WARNING);

		return false;
	}

	return true;
}